

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O2

void message_loop(string *filename,string *download_address,curl_off_t file_length,
                 download_status *status)

{
  list<Task_*,_std::allocator<Task_*>_> *this;
  size_type sVar1;
  queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_> *this_00;
  _List_node_base *p_Var2;
  _List_iterator<Task_*> task_i;
  curl_off_t cVar3;
  Task *this_01;
  size_type sVar4;
  long lVar5;
  iterator task_i_00;
  Task *task_reported;
  string *local_c0;
  string *local_b8;
  queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_> *local_b0;
  curl_off_t local_a8;
  Task *task_to_append;
  _List_node_base *local_98;
  proxy current_proxy;
  proxy local_60;
  
  this = &status->globalTaskList;
  local_b0 = &status->pending_proxy_servers;
  local_98 = (_List_node_base *)&status->globalProxyList;
  local_c0 = filename;
  local_b8 = download_address;
  local_a8 = file_length;
  do {
    if ((status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        (status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pthread_mutex_lock((pthread_mutex_t *)&tpListLock);
      pthread_mutex_lock((pthread_mutex_t *)&messageLock);
      task_reported =
           *(status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<Task_*,_std::allocator<Task_*>_>::pop_front
                ((deque<Task_*,_std::allocator<Task_*>_> *)status);
      pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
      p_Var2 = local_98;
      if (task_reported->status == 3) {
        std::__cxx11::list<proxy,_std::allocator<proxy>_>::remove
                  ((list<proxy,_std::allocator<proxy>_> *)local_98,
                   (char *)&task_reported->proxy_server);
        if ((((_List_base<proxy,_std::allocator<proxy>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next == p_Var2) {
          fputs("no proxy to use.",_stderr);
          exit(-1);
        }
        task_i = std::
                 __find_if<std::_List_iterator<Task*>,__gnu_cxx::__ops::_Iter_equals_val<Task*const>>
                           ((status->globalTaskList).
                            super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
                            super__List_node_base._M_next,this,&task_reported);
        cover_or_trim_task((iterator)task_i._M_node,local_c0,local_b8,status);
      }
      else {
        proxy::proxy(&current_proxy,&task_reported->proxy_server);
        cVar3 = Task::length(task_reported);
        this_00 = local_b0;
        task_i_00._M_node = (_List_node_base *)this;
        if (0x300000 < cVar3) {
          current_proxy.speed = task_reported->speed;
        }
        do {
          task_i_00._M_node = (task_i_00._M_node)->_M_next;
          if (task_i_00._M_node == (_List_node_base *)this) {
            if (local_a8 <=
                (long)(status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>.
                      _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[4]._M_next) {
              std::deque<proxy,_std::allocator<proxy>_>::push_back(&local_b0->c,&current_proxy);
              sVar4 = std::deque<proxy,_std::allocator<proxy>_>::size(&this_00->c);
              sVar1 = (status->globalProxyList).super__List_base<proxy,_std::allocator<proxy>_>.
                      _M_impl._M_node._M_size;
              std::__cxx11::string::~string((string *)&current_proxy);
              if (sVar4 == sVar1) {
                return;
              }
              goto LAB_00103cb8;
            }
            lVar5 = current_proxy.speed * 0x14;
            this_01 = (Task *)operator_new(0x68);
            proxy::proxy(&local_60,&task_reported->proxy_server);
            Task::Task(this_01,&local_60,
                       (curl_off_t)
                       (status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>.
                       _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[4]._M_next,0);
            std::__cxx11::string::~string((string *)&local_60);
            lVar5 = lVar5 + (long)(status->globalTaskList).
                                  super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
                                  super__List_node_base._M_prev[1]._M_next[4]._M_next;
            if (local_a8 <= lVar5) {
              lVar5 = local_a8;
            }
            this_01->end = lVar5;
            task_to_append = this_01;
            std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::push_back(this,&task_to_append);
            Task::execute(task_to_append,local_c0,local_b8,&status->taskMessageQueue);
            goto LAB_00103c75;
          }
        } while (*(short *)&task_i_00._M_node[1]._M_next[5]._M_next != 3);
        std::deque<proxy,_std::allocator<proxy>_>::push_back(&local_b0->c,&current_proxy);
        cover_or_trim_task(task_i_00,local_c0,local_b8,status);
LAB_00103c75:
        std::__cxx11::string::~string((string *)&current_proxy);
      }
LAB_00103cb8:
      pthread_mutex_unlock((pthread_mutex_t *)&tpListLock);
    }
    usleep(20000);
  } while( true );
}

Assistant:

void
message_loop(const string &filename, const string &download_address, curl_off_t file_length, download_status *status) {
    while (true) {
        if (!status->taskMessageQueue.empty()) {
            // 直接加锁了，不废话。
            pthread_mutex_lock(&tpListLock);
            pthread_mutex_lock(&messageLock);
            Task *task_reported = status->taskMessageQueue.front();
            status->taskMessageQueue.pop();
            pthread_mutex_unlock(&messageLock);
            if (task_reported->status == STATUS_ERROR) {
                // 下载出错，删去有问题的代理服务器，并尝试从空闲的代理中拿到新的来下载这块数据。
                status->globalProxyList.remove(task_reported->proxy_server);
                if (status->globalProxyList.empty()) {
                    fputs("no proxy to use.", stderr);
                    exit(-1);
                }
                cover_or_trim_task(find(status->globalTaskList.begin(), status->globalTaskList.end(), task_reported),
                                   filename, download_address, status);
                goto loop_end;
            } else {
                // 不是错误，就是成功了。下载成功，就重新查询列表中是否有失败的下载，如果有则要“切开”分配下载任务，在此之前，我们需要确定这个成功的代理服务器的下载速度。
                proxy current_proxy = task_reported->proxy_server;

                // 只有足够大的下载才算有效速度。
                if (task_reported->length() > MINI_DOWNLOAD_BYTES) {
                    current_proxy.speed = task_reported->speed;
                }
                // 声明当前代理闲置，切开有错误的下载或对其重新分配。
                for (auto new_task = status->globalTaskList.begin();
                     new_task != status->globalTaskList.end(); new_task++) {
                    if ((*new_task)->status == STATUS_ERROR) {
                        status->pending_proxy_servers.push(current_proxy);
                        cover_or_trim_task(new_task, filename, download_address, status);
                        goto loop_end;
                    }
                }
                // 遍历了所有任务，也找不到下载错误的任务，就分配新的任务让这个空出来的服务器下载。
                curl_off_t new_block_length = current_proxy.speed * EXPECT_DOWNLOAD_TIME_SEC;
                if (status->globalTaskList.back()->end < file_length) {
                    Task *task_to_append = new Task(task_reported->proxy_server, status->globalTaskList.back()->end, 0);
                    // 全局下载任务还没有分配到尽头，需要继续往下分配。
                    if (status->globalTaskList.back()->end + new_block_length < file_length) {
                        task_to_append->end = status->globalTaskList.back()->end + new_block_length;
                    } else {
                        // 整个下载在这个任务分配完毕后已经走到了尽头。
                        task_to_append->end = file_length;
                    }
                    status->globalTaskList.push_back(task_to_append);
                    task_to_append->execute(filename, download_address, &status->taskMessageQueue);
                    goto loop_end;
                } else {
                    // 找不到新块，就把代理服务器和下载速度放在待命区域，准备下载。
                    status->pending_proxy_servers.push(current_proxy);
                    if (status->pending_proxy_servers.size() == status->globalProxyList.size()) {
                        // 所有的服务器都已经空出来了，可以完成下载了。
                        return;
                    }
                    goto loop_end;
                }
            }
            loop_end:;
            pthread_mutex_unlock(&tpListLock);
        }
        usleep(20000);
    }
}